

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImGuiListClipperRange * __thiscall
ImVector<ImGuiListClipperRange>::insert
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *it,ImGuiListClipperRange *v)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long lVar3;
  ImGuiListClipperRange *pIVar4;
  undefined8 *in_RDX;
  ImVector<ImGuiListClipperRange> *in_RSI;
  ImVector<ImGuiListClipperRange> *in_RDI;
  ptrdiff_t off;
  
  lVar3 = ((long)in_RSI - (long)in_RDI->Data) / 0xc;
  if (in_RDI->Size == in_RDI->Capacity) {
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(in_RSI,(int)((ulong)in_RDX >> 0x20));
  }
  if (lVar3 < in_RDI->Size) {
    memmove(in_RDI->Data + lVar3 + 1,in_RDI->Data + lVar3,(in_RDI->Size - lVar3) * 0xc);
  }
  pIVar4 = in_RDI->Data + lVar3;
  uVar2 = *in_RDX;
  pIVar4->Min = (int)uVar2;
  pIVar4->Max = (int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined4 *)(in_RDX + 1);
  pIVar4->PosToIndexConvert = (bool)(char)uVar1;
  pIVar4->PosToIndexOffsetMin = (char)((uint)uVar1 >> 8);
  pIVar4->PosToIndexOffsetMax = (char)((uint)uVar1 >> 0x10);
  pIVar4->field_0xb = (char)((uint)uVar1 >> 0x18);
  in_RDI->Size = in_RDI->Size + 1;
  return in_RDI->Data + lVar3;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }